

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O1

string * __thiscall
fasttext::Args::metricToString_abi_cxx11_(string *__return_storage_ptr__,Args *this,metric_name mn)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (mn == labelf1score) {
    pcVar2 = "labelf1score";
    pcVar1 = "";
  }
  else if (mn == f1score) {
    pcVar2 = "f1score";
    pcVar1 = "";
  }
  else {
    pcVar2 = "Unknown metric name!";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Args::metricToString(metric_name mn) const {
  switch (mn) {
    case metric_name::f1score:
      return "f1score";
    case metric_name::labelf1score:
      return "labelf1score";
  }
  return "Unknown metric name!"; // should never happen
}